

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

void __thiscall
xatlas::internal::pack::Atlas::addCharts(Atlas *this,TaskScheduler *taskScheduler,Atlas *paramAtlas)

{
  Array<xatlas::internal::pack::Chart_*> *this_00;
  uint uVar1;
  Atlas *pAVar2;
  ulong uVar3;
  char *pcVar4;
  uint32_t newBufferSize;
  uint32_t uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  Task task;
  ThreadLocal<xatlas::internal::BoundingBox2D> boundingBox;
  TaskGroupHandle taskGroup;
  ThreadLocal<xatlas::internal::BoundingBox2D> local_78;
  uint32_t local_6c;
  TaskGroupHandle local_68;
  uint32_t local_64;
  ArrayBase local_60;
  Atlas *local_48;
  ulong local_40;
  Atlas *local_38;
  
  uVar8 = (ulong)(paramAtlas->m_chartGroups).m_base.size;
  if (uVar8 != 0) {
    uVar3 = 0;
    uVar5 = 0;
    do {
      lVar6 = *(long *)((paramAtlas->m_chartGroups).m_base.buffer + uVar3 * 8);
      if (*(char *)(lVar6 + 8) == '\0') {
        uVar5 = uVar5 + *(int *)(lVar6 + 0x54);
      }
      uVar3 = uVar3 + 1;
    } while (uVar8 != uVar3);
    if (uVar5 != 0) {
      local_60.buffer = (uint8_t *)0x0;
      local_60.elementSize = 0x18;
      local_60.capacity = 0;
      local_60.size = uVar5;
      ArrayBase::setArrayCapacity(&local_60,uVar5);
      local_68 = TaskScheduler::createTaskGroup(taskScheduler,uVar5);
      local_6c = uVar5;
      local_64 = local_68.value;
      local_48 = this;
      ThreadLocal<xatlas::internal::BoundingBox2D>::ThreadLocal(&local_78);
      if (uVar8 != 0) {
        uVar3 = 0;
        uVar9 = 0;
        local_40 = uVar8;
        local_38 = paramAtlas;
        do {
          if ((paramAtlas->m_chartGroups).m_base.size <= uVar3) {
            pcVar4 = 
            "const T &xatlas::internal::Array<xatlas::internal::param::ChartGroup *>::operator[](uint32_t) const [T = xatlas::internal::param::ChartGroup *]"
            ;
LAB_001a7e8d:
            __assert_fail("index < m_base.size",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                          ,0x4a8,pcVar4);
          }
          lVar6 = *(long *)((paramAtlas->m_chartGroups).m_base.buffer + uVar3 * 8);
          if ((*(char *)(lVar6 + 8) == '\0') && (uVar1 = *(uint *)(lVar6 + 0x54), (ulong)uVar1 != 0)
             ) {
            lVar7 = (ulong)uVar9 * 0x18;
            uVar8 = 0;
            do {
              if ((ulong)local_60.size <= uVar9 + uVar8) goto LAB_001a7e59;
              *(ThreadLocal<xatlas::internal::BoundingBox2D> **)(local_60.buffer + lVar7) =
                   &local_78;
              if (*(uint *)(lVar6 + 0x54) <= uVar8) {
                pcVar4 = 
                "const T &xatlas::internal::Array<xatlas::internal::param::Chart *>::operator[](uint32_t) const [T = xatlas::internal::param::Chart *]"
                ;
                goto LAB_001a7e8d;
              }
              *(undefined8 *)(local_60.buffer + lVar7 + 8) =
                   *(undefined8 *)(*(long *)(lVar6 + 0x48) + uVar8 * 8);
              task.userData = local_60.buffer + lVar7;
              task.func = runAddChartTask;
              TaskScheduler::run(taskScheduler,local_68,task);
              uVar8 = uVar8 + 1;
              lVar7 = lVar7 + 0x18;
            } while (uVar1 != uVar8);
            uVar9 = uVar9 + (int)uVar8;
            uVar8 = local_40;
            paramAtlas = local_38;
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != uVar8);
      }
      TaskScheduler::wait(taskScheduler,&local_64);
      pAVar2 = local_48;
      uVar5 = local_6c;
      this_00 = &local_48->m_charts;
      (local_48->m_charts).m_base.size = local_6c;
      uVar9 = local_6c;
      if ((local_48->m_charts).m_base.capacity < local_6c) {
        ArrayBase::setArrayCapacity(&this_00->m_base,local_6c);
        uVar9 = (pAVar2->m_charts).m_base.size;
      }
      lVar6 = 0x10;
      uVar8 = 0;
      do {
        if (local_60.size == uVar8) {
LAB_001a7e59:
          pcVar4 = 
          "T &xatlas::internal::Array<xatlas::internal::pack::AddChartTaskArgs>::operator[](uint32_t) [T = xatlas::internal::pack::AddChartTaskArgs]"
          ;
LAB_001a7e6e:
          __assert_fail("index < m_base.size",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x4ae,pcVar4);
        }
        if (uVar9 == uVar8) {
          pcVar4 = 
          "T &xatlas::internal::Array<xatlas::internal::pack::Chart *>::operator[](uint32_t) [T = xatlas::internal::pack::Chart *]"
          ;
          goto LAB_001a7e6e;
        }
        *(undefined8 *)((this_00->m_base).buffer + uVar8 * 8) =
             *(undefined8 *)(local_60.buffer + lVar6);
        uVar8 = uVar8 + 1;
        lVar6 = lVar6 + 0x18;
      } while (uVar5 != uVar8);
      ThreadLocal<xatlas::internal::BoundingBox2D>::~ThreadLocal(&local_78);
      ArrayBase::~ArrayBase(&local_60);
    }
  }
  return;
}

Assistant:

void addCharts(TaskScheduler *taskScheduler, param::Atlas *paramAtlas)
	{
		// Count charts.
		uint32_t chartCount = 0;
		const uint32_t chartGroupsCount = paramAtlas->chartGroupCount();
		for (uint32_t i = 0; i < chartGroupsCount; i++) {
			const param::ChartGroup *chartGroup = paramAtlas->chartGroupAt(i);
			if (chartGroup->isVertexMap())
				continue;
			chartCount += chartGroup->chartCount();
		}
		if (chartCount == 0)
			return;
		// Run one task per chart.
		Array<AddChartTaskArgs> taskArgs;
		taskArgs.resize(chartCount);
		TaskGroupHandle taskGroup = taskScheduler->createTaskGroup(chartCount);
		uint32_t chartIndex = 0;
		ThreadLocal<BoundingBox2D> boundingBox;
		for (uint32_t i = 0; i < chartGroupsCount; i++) {
			const param::ChartGroup *chartGroup = paramAtlas->chartGroupAt(i);
			if (chartGroup->isVertexMap())
				continue;
			const uint32_t count = chartGroup->chartCount();
			for (uint32_t j = 0; j < count; j++) {
				AddChartTaskArgs &args = taskArgs[chartIndex];
				args.boundingBox = &boundingBox;
				args.paramChart = chartGroup->chartAt(j);
				Task task;
				task.userData = &taskArgs[chartIndex];
				task.func = runAddChartTask;
				taskScheduler->run(taskGroup, task);
				chartIndex++;
			}
		}
		taskScheduler->wait(&taskGroup);
		// Get task output.
		m_charts.resize(chartCount);
		for (uint32_t i = 0; i < chartCount; i++)
			m_charts[i] = taskArgs[i].chart;
	}